

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode Curl_hsts_loadfile(Curl_easy *data,hsts *h,char *file)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  char *pcVar4;
  stsentry *psVar5;
  CURLcode CVar6;
  char *pcVar7;
  time_t expires;
  bool subdomain;
  char host [257];
  char local_78 [72];
  
  (*Curl_cfree)(h->filename);
  pcVar3 = (*Curl_cstrdup)(file);
  h->filename = pcVar3;
  CVar6 = CURLE_OUT_OF_MEMORY;
  if (pcVar3 != (char *)0x0) {
    __stream = fopen64(file,"r");
    if (__stream != (FILE *)0x0) {
      pcVar3 = (char *)(*Curl_cmalloc)(0xfff);
      if (pcVar3 == (char *)0x0) {
        (*Curl_cfree)(h->filename);
        h->filename = (char *)0x0;
        fclose(__stream);
        return CURLE_OUT_OF_MEMORY;
      }
      while( true ) {
        pcVar4 = Curl_get_line(pcVar3,0xfff,(FILE *)__stream);
        pcVar7 = pcVar3;
        if (pcVar4 == (char *)0x0) break;
        for (; (cVar1 = *pcVar7, cVar1 == '\t' || (cVar1 == ' ')); pcVar7 = pcVar7 + 1) {
        }
        if ((cVar1 != '#') &&
           (iVar2 = __isoc99_sscanf(pcVar7,"%256s \"%64[^\"]\"",host,local_78), iVar2 == 2)) {
          iVar2 = bcmp(local_78,"unlimited",10);
          expires = 0x7fffffffffffffff;
          if (iVar2 != 0) {
            expires = Curl_getdate_capped(local_78);
          }
          cVar1 = host[0];
          subdomain = host[0] == '.';
          psVar5 = Curl_hsts(h,host + subdomain,subdomain);
          if (psVar5 == (stsentry *)0x0) {
            hsts_create(h,host + subdomain,cVar1 == '.',expires);
          }
          else if (psVar5->expires < expires) {
            psVar5->expires = expires;
          }
        }
      }
      (*Curl_cfree)(pcVar3);
      fclose(__stream);
    }
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_hsts_loadfile(struct Curl_easy *data,
                            struct hsts *h, const char *file)
{
  DEBUGASSERT(h);
  (void)data;
  return hsts_load(h, file);
}